

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fpconv.cpp
# Opt level: O0

void normalize(Fp *fp)

{
  int shift;
  Fp *fp_local;
  
  while ((fp->frac & 0x10000000000000) == 0) {
    fp->frac = fp->frac << 1;
    fp->exp = fp->exp + -1;
  }
  fp->frac = fp->frac << 0xb;
  fp->exp = fp->exp + -0xb;
  return;
}

Assistant:

static void normalize(Fp* fp) {
  while ((fp->frac & hiddenbit) == 0) {
    fp->frac <<= 1;
    fp->exp--;
  }

  int shift = 64 - 52 - 1;
  fp->frac <<= shift;
  fp->exp -= shift;
}